

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format_priv.h
# Opt level: O2

void _ST_PRIVATE::format_numeric_s<signed_char>
               (format_spec *format,format_writer *output,char value)

{
  bool upper_case;
  byte bVar1;
  int radix;
  uint_formatter<unsigned_char> formatter;
  
  radix = 10;
  switch(format->digit_class) {
  case digit_default:
  case digit_dec:
    break;
  case digit_hex:
    radix = 0x10;
    break;
  case digit_hex_upper:
    radix = 0x10;
    upper_case = true;
    goto LAB_001c15d6;
  case digit_oct:
    radix = 8;
    break;
  case digit_bin:
    upper_case = false;
    radix = 2;
    goto LAB_001c15d6;
  default:
    assert_handler("/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_format_priv.h"
                   ,0x94,"Invalid digit class for _format_numeric_s");
  }
  upper_case = false;
LAB_001c15d6:
  formatter.m_start = (char *)0x0;
  ST::uint_formatter<unsigned_char>::format
            (&formatter,(value ^ value >> 7) - (value >> 7),radix,upper_case);
  bVar1 = (byte)value >> 7;
  if (value == '\0') {
    bVar1 = 2;
  }
  format_numeric_string
            (format,output,formatter.m_start,(long)&formatter + (8 - (long)formatter.m_start),
             (uint)bVar1);
  return;
}

Assistant:

void format_numeric_s(const ST::format_spec &format,
                          ST::format_writer &output, int_T value)
    {
        static_assert(std::is_signed<int_T>::value,
                      "Use _format_numeric_u for unsigned numerics");

        int radix = 10;
        bool upper_case = false;
        switch (format.digit_class) {
        case ST::digit_hex_upper:
            upper_case = true;
            /* fall through */
        case ST::digit_hex:
            radix = 16;
            break;
        case ST::digit_oct:
            radix = 8;
            break;
        case ST::digit_bin:
            radix = 2;
            break;
        case ST::digit_dec:
        case ST::digit_default:
            break;
        default:
            ST_ASSERT(false, "Invalid digit class for _format_numeric_s");
        }

        typedef typename std::make_unsigned<int_T>::type uint_T;
        ST::uint_formatter<uint_T> formatter;
        formatter.format(static_cast<uint_T>(std::abs(value)), radix, upper_case);

        const numeric_type ntype = (value == 0) ? numeric_zero
                                 : (value < 0) ? numeric_negative
                                 : numeric_positive;

        format_numeric_string(format, output, formatter.text(), formatter.size(), ntype);
    }